

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsWin32Executable(cmGeneratorTarget *this,string *config)

{
  cmLocalGenerator *lg;
  bool bVar1;
  string *psVar2;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  string_view local_28;
  string *local_18;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_18 = config;
  config_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"WIN32_EXECUTABLE",&local_89);
  psVar2 = GetSafeProperty(this,&local_88);
  std::__cxx11::string::string((string *)&local_68,(string *)psVar2);
  psVar2 = local_18;
  lg = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_c0);
  cmGeneratorExpression::Evaluate
            (&local_48,&local_68,lg,psVar2,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_c0);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  bVar1 = cmIsOn(local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::IsWin32Executable(const std::string& config) const
{
  return cmIsOn(cmGeneratorExpression::Evaluate(
    this->GetSafeProperty("WIN32_EXECUTABLE"), this->LocalGenerator, config));
}